

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O2

bool __thiscall
density::
lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::try_dyn_push_copy(lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                    *this,progress_guarantee i_progress_guarantee,runtime_type *i_type,
                   void *i_source)

{
  void *pvVar1;
  put_transaction<void> tranasction;
  put_transaction<void> local_48;
  put_transaction<void> local_28;
  
  try_start_dyn_push_copy(&local_28,this,i_progress_guarantee,i_type,i_source);
  local_48.m_put.m_control_block = local_28.m_put.m_control_block;
  local_48.m_put.m_next_ptr = local_28.m_put.m_next_ptr;
  local_48.m_put.m_user_storage = local_28.m_put.m_user_storage;
  local_48.m_queue = local_28.m_queue;
  local_28.m_put.m_user_storage = (void *)0x0;
  put_transaction<void>::~put_transaction(&local_28);
  pvVar1 = local_48.m_put.m_user_storage;
  if (local_48.m_put.m_user_storage != (void *)0x0) {
    put_transaction<void>::commit(&local_48);
  }
  put_transaction<void>::~put_transaction(&local_48);
  return pvVar1 != (void *)0x0;
}

Assistant:

bool try_dyn_push_copy(
          progress_guarantee   i_progress_guarantee,
          const runtime_type & i_type,
          const void *         i_source)
        {
            auto tranasction = try_start_dyn_push_copy(i_progress_guarantee, i_type, i_source);
            if (!tranasction)
                return false;
            tranasction.commit();
            return true;
        }